

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::RenderStairs<ImPlot::GetterXsYs<unsigned_long_long>,ImPlot::TransformerLinLog>
               (GetterXsYs<unsigned_long_long> *getter,TransformerLinLog *transformer,
               ImDrawList *DrawList,float line_weight,ImU32 col)

{
  float *pfVar1;
  unsigned_long_long uVar2;
  ImPlotPlot *pIVar3;
  ImPlotContext *pIVar4;
  ImPlotContext *pIVar5;
  ImDrawList *this;
  long lVar6;
  int iVar7;
  int iVar8;
  ImPlotContext *gp;
  float fVar9;
  double dVar10;
  double dVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  ImVec2 p2;
  ImVec2 p12;
  ImVec2 p1;
  ImVec2 local_88;
  ImVec2 local_80;
  undefined1 local_78 [24];
  ImDrawList *local_60;
  undefined1 local_58 [8];
  TransformerLinLog *local_50;
  int local_48;
  ImU32 local_44;
  float local_40;
  ImVec2 local_3c;
  
  pIVar4 = GImPlot;
  pIVar3 = GImPlot->CurrentPlot;
  local_60 = DrawList;
  if (((pIVar3->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true)) {
    iVar7 = getter->Count;
    local_48 = iVar7 + -1;
    local_40 = line_weight * 0.5;
    local_3c.x = 0.0;
    local_3c.y = 0.0;
    lVar6 = (long)((getter->Offset % iVar7 + iVar7) % iVar7) * (long)getter->Stride;
    uVar2 = *(unsigned_long_long *)((long)getter->Xs + lVar6);
    local_78._8_8_ = (double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) - 1.9342813113834067e+25;
    local_78._0_8_ =
         (double)local_78._8_8_ + ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0);
    uVar2 = *(unsigned_long_long *)((long)getter->Ys + lVar6);
    auVar14._8_4_ = (int)(uVar2 >> 0x20);
    auVar14._0_8_ = uVar2;
    auVar14._12_4_ = 0x45300000;
    local_58 = (undefined1  [8])getter;
    local_50 = transformer;
    local_44 = col;
    dVar10 = log10(((auVar14._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) /
                   pIVar3->YAxis[transformer->YAxis].Range.Min);
    iVar7 = transformer->YAxis;
    pIVar3 = pIVar4->CurrentPlot;
    dVar11 = pIVar3->YAxis[iVar7].Range.Min;
    local_3c.y = (float)((((double)(float)(dVar10 / pIVar4->LogDenY[iVar7]) *
                           (pIVar3->YAxis[iVar7].Range.Max - dVar11) + dVar11) - dVar11) *
                         pIVar4->My[iVar7] + (double)pIVar4->PixelRange[iVar7].Min.y);
    local_3c.x = (float)(((double)local_78._0_8_ - (pIVar3->XAxis).Range.Min) * pIVar4->Mx +
                        (double)pIVar4->PixelRange[iVar7].Min.x);
    RenderPrimitives<ImPlot::StairsRenderer<ImPlot::GetterXsYs<unsigned_long_long>,ImPlot::TransformerLinLog>>
              ((StairsRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::TransformerLinLog> *)
               local_58,local_60,&pIVar3->PlotRect);
  }
  else {
    iVar7 = getter->Count;
    lVar6 = (long)((getter->Offset % iVar7 + iVar7) % iVar7) * (long)getter->Stride;
    uVar2 = *(unsigned_long_long *)((long)getter->Xs + lVar6);
    dVar11 = (double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) - 1.9342813113834067e+25;
    local_78._8_4_ = SUB84(dVar11,0);
    local_78._0_8_ = dVar11 + ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0);
    local_78._12_4_ = (int)((ulong)dVar11 >> 0x20);
    uVar2 = *(unsigned_long_long *)((long)getter->Ys + lVar6);
    dVar10 = log10((((double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) /
                   pIVar3->YAxis[transformer->YAxis].Range.Min);
    iVar7 = transformer->YAxis;
    pIVar3 = pIVar4->CurrentPlot;
    dVar11 = pIVar3->YAxis[iVar7].Range.Min;
    local_58._4_4_ =
         (float)((((double)(float)(dVar10 / pIVar4->LogDenY[iVar7]) *
                   (pIVar3->YAxis[iVar7].Range.Max - dVar11) + dVar11) - dVar11) * pIVar4->My[iVar7]
                + (double)pIVar4->PixelRange[iVar7].Min.y);
    local_58._0_4_ =
         (float)(((double)local_78._0_8_ - (pIVar3->XAxis).Range.Min) * pIVar4->Mx +
                (double)pIVar4->PixelRange[iVar7].Min.x);
    iVar7 = getter->Count;
    if (1 < iVar7) {
      iVar8 = 1;
      do {
        pIVar5 = GImPlot;
        lVar6 = (long)(((getter->Offset + iVar8) % iVar7 + iVar7) % iVar7) * (long)getter->Stride;
        uVar2 = *(unsigned_long_long *)((long)getter->Xs + lVar6);
        dVar11 = (double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) - 1.9342813113834067e+25;
        local_78._8_4_ = SUB84(dVar11,0);
        local_78._0_8_ = dVar11 + ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0);
        local_78._12_4_ = (int)((ulong)dVar11 >> 0x20);
        uVar2 = *(unsigned_long_long *)((long)getter->Ys + lVar6);
        dVar10 = log10((((double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) - 1.9342813113834067e+25)
                       + ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) /
                       GImPlot->CurrentPlot->YAxis[transformer->YAxis].Range.Min);
        this = local_60;
        iVar7 = transformer->YAxis;
        pIVar3 = pIVar5->CurrentPlot;
        dVar11 = pIVar3->YAxis[iVar7].Range.Min;
        fVar12 = (float)(((double)local_78._0_8_ - (pIVar3->XAxis).Range.Min) * pIVar5->Mx +
                        (double)pIVar5->PixelRange[iVar7].Min.x);
        fVar9 = (float)((((double)(float)(dVar10 / pIVar5->LogDenY[iVar7]) *
                          (pIVar3->YAxis[iVar7].Range.Max - dVar11) + dVar11) - dVar11) *
                        pIVar5->My[iVar7] + (double)pIVar5->PixelRange[iVar7].Min.y);
        local_88.y = fVar9;
        local_88.x = fVar12;
        pIVar3 = pIVar4->CurrentPlot;
        fVar13 = (float)local_58._4_4_;
        if (fVar9 <= (float)local_58._4_4_) {
          fVar13 = fVar9;
        }
        if ((fVar13 < (pIVar3->PlotRect).Max.y) &&
           (fVar13 = (float)(~-(uint)(fVar9 <= (float)local_58._4_4_) & (uint)fVar9 |
                            -(uint)(fVar9 <= (float)local_58._4_4_) & local_58._4_4_),
           pfVar1 = &(pIVar3->PlotRect).Min.y, *pfVar1 <= fVar13 && fVar13 != *pfVar1)) {
          fVar13 = (float)local_58._0_4_;
          if (fVar12 <= (float)local_58._0_4_) {
            fVar13 = fVar12;
          }
          if ((fVar13 < (pIVar3->PlotRect).Max.x) &&
             (fVar13 = (float)(~-(uint)(fVar12 <= (float)local_58._0_4_) & (uint)fVar12 |
                              local_58._0_4_ & -(uint)(fVar12 <= (float)local_58._0_4_)),
             (pIVar3->PlotRect).Min.x <= fVar13 && fVar13 != (pIVar3->PlotRect).Min.x)) {
            local_80.y = (float)local_58._4_4_;
            local_80.x = fVar12;
            ImDrawList::AddLine(local_60,(ImVec2 *)local_58,&local_80,col,line_weight);
            ImDrawList::AddLine(this,&local_80,&local_88,col,line_weight);
          }
        }
        local_58._0_4_ = local_88.x;
        local_58._4_4_ = local_88.y;
        iVar8 = iVar8 + 1;
        iVar7 = getter->Count;
      } while (iVar8 < iVar7);
    }
  }
  return;
}

Assistant:

inline void RenderStairs(const Getter& getter, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        ImVec2 p1 = transformer(getter(0));
        for (int i = 1; i < getter.Count; ++i) {
            ImVec2 p2 = transformer(getter(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2)))) {
                ImVec2 p12(p2.x, p1.y);
                DrawList.AddLine(p1, p12, col, line_weight);
                DrawList.AddLine(p12, p2, col, line_weight);
            }
            p1 = p2;
        }
    }
    else {
        RenderPrimitives(StairsRenderer<Getter,Transformer>(getter, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}